

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_load_certificates(ptls_context_t *ctx,char *cert_pem_file)

{
  ptls_iovec_t *ppVar1;
  int local_1c;
  int ret;
  char *cert_pem_file_local;
  ptls_context_t *ctx_local;
  
  ppVar1 = (ptls_iovec_t *)malloc(0x100);
  (ctx->certificates).list = ppVar1;
  if ((ctx->certificates).list == (ptls_iovec_t *)0x0) {
    local_1c = 0x201;
  }
  else {
    local_1c = ptls_load_pem_objects
                         (cert_pem_file,"CERTIFICATE",(ctx->certificates).list,0x10,
                          &(ctx->certificates).count);
  }
  return local_1c;
}

Assistant:

int ptls_load_certificates(ptls_context_t *ctx, char const *cert_pem_file)
{
    int ret = 0;

    ctx->certificates.list = (ptls_iovec_t *)malloc(PTLS_MAX_CERTS_IN_CONTEXT * sizeof(ptls_iovec_t));

    if (ctx->certificates.list == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
    } else {
        ret = ptls_load_pem_objects(cert_pem_file, "CERTIFICATE", ctx->certificates.list, PTLS_MAX_CERTS_IN_CONTEXT,
                                    &ctx->certificates.count);
    }

    return ret;
}